

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

void __thiscall
Js::RecyclableArgumentsObjectDisplay::RecyclableArgumentsObjectDisplay
          (RecyclableArgumentsObjectDisplay *this,ResolvedObject *resolvedObject,
          LocalsWalker *localsWalker)

{
  LocalsWalker *localsWalker_local;
  ResolvedObject *resolvedObject_local;
  RecyclableArgumentsObjectDisplay *this_local;
  
  RecyclableObjectDisplay::RecyclableObjectDisplay
            (&this->super_RecyclableObjectDisplay,resolvedObject,0);
  (this->super_RecyclableObjectDisplay).super_IDiagObjectModelDisplay._vptr_IDiagObjectModelDisplay
       = (_func_int **)&PTR_Name_01deab80;
  this->pLocalsWalker = localsWalker;
  return;
}

Assistant:

RecyclableArgumentsObjectDisplay::RecyclableArgumentsObjectDisplay(ResolvedObject* resolvedObject, LocalsWalker *localsWalker)
        : RecyclableObjectDisplay(resolvedObject), pLocalsWalker(localsWalker)
    {
    }